

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall State::update(State *this)

{
  ulong uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 uVar9;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  pointer pBVar19;
  uint in_EDX;
  pointer pBVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  float fVar37;
  ulong local_68;
  
  pBVar19 = (this->balls).super__Vector_base<Ball,_std::allocator<Ball>_>._M_impl.
            super__Vector_impl_data._M_start;
  pBVar20 = (this->balls).super__Vector_base<Ball,_std::allocator<Ball>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pBVar19 == pBVar20) {
    fVar26 = 0.0;
  }
  else {
    fVar27 = this->dt;
    fVar26 = 0.0;
    do {
      uVar2 = pBVar19->vx;
      uVar10 = pBVar19->vy;
      uVar3 = pBVar19->x;
      uVar11 = pBVar19->y;
      fVar36 = (float)uVar2 * fVar27 + (float)uVar3;
      fVar37 = (float)uVar10 * fVar27 + (float)uVar11;
      pBVar19->x = fVar36;
      pBVar19->y = fVar37;
      fVar35 = pBVar19->vz * fVar27 + pBVar19->z;
      pBVar19->z = fVar35;
      fVar29 = pBVar19->r;
      if (fVar36 - fVar29 < -1.0) {
        pBVar19->vx = ABS((float)uVar2);
      }
      if (fVar37 - fVar29 < -1.0) {
        pBVar19->vy = ABS((float)uVar10);
      }
      if (fVar35 - fVar29 < -1.0) {
        pBVar19->vz = ABS(pBVar19->vz);
      }
      if (1.0 < fVar36 + fVar29) {
        pBVar19->vx = (float)((uint)pBVar19->vx | 0x80000000);
      }
      if (1.0 < fVar37 + fVar29) {
        pBVar19->vy = (float)((uint)pBVar19->vy | 0x80000000);
      }
      if (1.0 < fVar29 + fVar35) {
        pBVar19->vz = (float)((uint)pBVar19->vz | 0x80000000);
      }
      if (((fVar36 < -2.0) || (fVar37 < -2.0)) || (2.0 < fVar35)) {
LAB_001035e9:
        uVar4 = pBVar19->x;
        uVar12 = pBVar19->y;
        auVar33._4_4_ = uVar12;
        auVar33._0_4_ = uVar4;
        auVar33._8_8_ = 0;
        auVar34 = maxps(_DAT_00105070,auVar33);
        auVar34 = minps(_DAT_00105080,auVar34);
        pBVar19->x = (float)(int)auVar34._0_8_;
        pBVar19->y = (float)(int)((ulong)auVar34._0_8_ >> 0x20);
        fVar29 = -1.0;
        if (-1.0 <= pBVar19->z) {
          fVar29 = pBVar19->z;
        }
        fVar35 = 1.0;
        if (fVar29 <= 1.0) {
          fVar35 = fVar29;
        }
        pBVar19->z = fVar35;
      }
      else {
        iVar24 = -(uint)(2.0 < fVar36);
        iVar25 = -(uint)(2.0 < fVar37);
        auVar32._4_4_ = iVar25;
        auVar32._0_4_ = iVar24;
        auVar32._8_4_ = iVar25;
        auVar32._12_4_ = iVar25;
        auVar34._8_8_ = auVar32._8_8_;
        auVar34._4_4_ = iVar24;
        auVar34._0_4_ = iVar24;
        in_EDX = movmskpd(in_EDX,auVar34);
        if ((((byte)((byte)in_EDX >> 1) != 0) || ((in_EDX & 1) != 0)) || (fVar35 < 2.0))
        goto LAB_001035e9;
      }
      fVar26 = fVar26 + (pBVar19->vz * pBVar19->vz +
                        pBVar19->vx * pBVar19->vx + pBVar19->vy * pBVar19->vy) * pBVar19->m;
      pBVar19 = pBVar19 + 1;
    } while (pBVar19 != pBVar20);
  }
  this->energy = fVar26;
  pBVar19 = (this->balls).super__Vector_base<Ball,_std::allocator<Ball>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->balls).super__Vector_base<Ball,_std::allocator<Ball>_>._M_impl.super__Vector_impl_data.
      _M_finish != pBVar19) {
    local_68 = 1;
    lVar22 = 0x3c;
    uVar23 = 0;
    do {
      uVar1 = uVar23 + 1;
      pBVar20 = (this->balls).super__Vector_base<Ball,_std::allocator<Ball>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (uVar1 < (ulong)((long)(this->balls).super__Vector_base<Ball,_std::allocator<Ball>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pBVar20 >> 5)) {
        pBVar19 = pBVar19 + uVar23;
        lVar21 = lVar22;
        uVar23 = local_68;
        do {
          uVar5 = pBVar19->x;
          uVar13 = pBVar19->y;
          uVar9 = *(undefined8 *)((long)pBVar20 + lVar21 + -0x14);
          fVar29 = (float)uVar5 - (float)uVar9;
          fVar35 = (float)uVar13 - (float)((ulong)uVar9 >> 0x20);
          fVar36 = pBVar19->z - *(float *)((long)pBVar20 + lVar21 + -0xc);
          fVar27 = pBVar19->r + *(float *)((long)pBVar20 + lVar21 + -0x1c);
          fVar26 = fVar36 * fVar36 + fVar29 * fVar29 + fVar35 * fVar35;
          if (fVar26 <= fVar27 * fVar27) {
            auVar18._4_4_ = fVar35;
            auVar18._0_4_ = fVar29;
            if (fVar26 < 0.0) {
              fVar26 = sqrtf(fVar26);
            }
            else {
              fVar26 = SQRT(fVar26);
            }
            fVar36 = fVar36 / fVar26;
            fVar27 = *(float *)((long)&pBVar20->r + lVar21);
            fVar29 = *(float *)((long)pBVar20 + lVar21 + -0x18);
            fVar35 = 1.0 / (pBVar19->m + fVar29);
            auVar18._8_8_ = 0;
            auVar17._4_4_ = fVar26;
            auVar17._0_4_ = fVar26;
            auVar17._8_4_ = fVar26;
            auVar17._12_4_ = fVar26;
            auVar34 = divps(auVar18,auVar17);
            uVar9 = *(undefined8 *)((long)pBVar20 + lVar21 + -8);
            fVar37 = (float)uVar9;
            fVar28 = (float)((ulong)uVar9 >> 0x20);
            uVar6 = pBVar19->vx;
            uVar14 = pBVar19->vy;
            fVar30 = auVar34._0_4_;
            fVar31 = auVar34._4_4_;
            fVar35 = ((pBVar19->vz - fVar27) * fVar36 +
                     ((float)uVar6 - fVar37) * fVar30 + fVar31 * ((float)uVar14 - fVar28)) *
                     (fVar35 + fVar35);
            fVar29 = -fVar29 * fVar35;
            fVar35 = fVar35 * pBVar19->m;
            fVar37 = fVar35 * fVar30 + fVar37;
            fVar28 = fVar35 * fVar31 + fVar28;
            fVar27 = fVar35 * fVar36 + fVar27;
            pBVar19->vx = fVar29 * fVar30 + (float)uVar6;
            pBVar19->vy = fVar29 * fVar31 + (float)uVar14;
            pBVar19->vz = fVar29 * fVar36 + pBVar19->vz;
            *(ulong *)((long)pBVar20 + lVar21 + -8) = CONCAT44(fVar28,fVar37);
            *(float *)((long)&pBVar20->r + lVar21) = fVar27;
            uVar7 = pBVar19->vx;
            uVar15 = pBVar19->vy;
            fVar29 = (fVar36 * pBVar19->vz + fVar30 * (float)uVar7 + (float)uVar15 * fVar31) -
                     (fVar36 * fVar27 + fVar30 * fVar37 + fVar28 * fVar31);
            if (1e-05 < ABS(fVar29)) {
              fVar29 = ((*(float *)((long)pBVar20 + lVar21 + -0x1c) + pBVar19->r) * 1.01 - fVar26) /
                       fVar29;
              uVar8 = pBVar19->x;
              uVar16 = pBVar19->y;
              pBVar19->x = (float)uVar7 * fVar29 + (float)uVar8;
              pBVar19->y = (float)uVar15 * fVar29 + (float)uVar16;
              pBVar19->z = pBVar19->vz * fVar29 + pBVar19->z;
              uVar9 = *(undefined8 *)((long)pBVar20 + lVar21 + -0x14);
              *(ulong *)((long)pBVar20 + lVar21 + -0x14) =
                   CONCAT44(fVar28 * fVar29 + (float)((ulong)uVar9 >> 0x20),
                            fVar37 * fVar29 + (float)uVar9);
              *(float *)((long)pBVar20 + lVar21 + -0xc) =
                   fVar27 * fVar29 + *(float *)((long)pBVar20 + lVar21 + -0xc);
            }
          }
          uVar23 = uVar23 + 1;
          pBVar20 = (this->balls).super__Vector_base<Ball,_std::allocator<Ball>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar21 = lVar21 + 0x20;
        } while (uVar23 < (ulong)((long)(this->balls).
                                        super__Vector_base<Ball,_std::allocator<Ball>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)pBVar20 >> 5));
      }
      pBVar19 = (this->balls).super__Vector_base<Ball,_std::allocator<Ball>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_68 = local_68 + 1;
      lVar22 = lVar22 + 0x20;
      uVar23 = uVar1;
    } while (uVar1 < (ulong)((long)(this->balls).super__Vector_base<Ball,_std::allocator<Ball>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pBVar19 >> 5));
  }
  this->t = this->dt + this->t;
  return;
}

Assistant:

void update() {
        float energy = 0.0;

        for (auto & ball : balls) {
            ball.x += ball.vx*dt;
            ball.y += ball.vy*dt;
            ball.z += ball.vz*dt;

            if (ball.x - ball.r < -1.0f) ball.vx =  std::abs(ball.vx);
            if (ball.y - ball.r < -1.0f) ball.vy =  std::abs(ball.vy);
            if (ball.z - ball.r < -1.0f) ball.vz =  std::abs(ball.vz);
            if (ball.x + ball.r >  1.0f) ball.vx = -std::abs(ball.vx);
            if (ball.y + ball.r >  1.0f) ball.vy = -std::abs(ball.vy);
            if (ball.z + ball.r >  1.0f) ball.vz = -std::abs(ball.vz);

            if (ball.x < -2.0f || ball.y < -2.0f || ball.z < 2.0f || ball.x > 2.0f || ball.y > 2.0f || ball.z > 2.0f) {
                ball.x = std::max(ball.x, -1.0f);
                ball.x = std::min(ball.x,  1.0f);
                ball.y = std::max(ball.y, -1.0f);
                ball.y = std::min(ball.y,  1.0f);
                ball.z = std::max(ball.z, -1.0f);
                ball.z = std::min(ball.z,  1.0f);
            }

            energy += ball.m*(ball.vx*ball.vx + ball.vy*ball.vy + ball.vz*ball.vz);
        }

        this->energy = energy;

        for (int i = 0; i < balls.size(); ++i) {
            auto & c0 = balls[i];
            for (int j = i + 1; j < balls.size(); ++j) {
                auto & c1 = balls[j];

                float d2 = ::dist2(c0, c1);
                if (d2 > ::dist2(c0.r, c1.r)) continue;

                float nx = c0.x - c1.x;
                float ny = c0.y - c1.y;
                float nz = c0.z - c1.z;
                float d = sqrt(d2);
                nx /= d;
                ny /= d;
                nz /= d;

                float dvx = c0.vx - c1.vx;
                float dvy = c0.vy - c1.vy;
                float dvz = c0.vz - c1.vz;
                float norm = 1.0f/(c0.m + c1.m);

                float p = 2.0f*norm*(dvx*nx + dvy*ny + dvz*nz);
                float vx0 = c0.vx - c1.m*p*nx;
                float vy0 = c0.vy - c1.m*p*ny;
                float vz0 = c0.vz - c1.m*p*nz;
                float vx1 = c1.vx + c0.m*p*nx;
                float vy1 = c1.vy + c0.m*p*ny;
                float vz1 = c1.vz + c0.m*p*nz;

                c0.vx = vx0;
                c0.vy = vy0;
                c0.vz = vz0;
                c1.vx = vx1;
                c1.vy = vy1;
                c1.vz = vz1;

                float l = 1.01f*(c0.r + c1.r) - d;

                float nv0 = c0.vx*nx + c0.vy*ny + c0.vz*nz;
                float nv1 = c1.vx*nx + c1.vy*ny + c1.vz*nz;
                if (std::abs(nv0 - nv1) > 1e-5) {
                    float dt = l/(nv0 - nv1);

                    c0.x += c0.vx*dt;
                    c0.y += c0.vy*dt;
                    c0.z += c0.vz*dt;
                    c1.x += c1.vx*dt;
                    c1.y += c1.vy*dt;
                    c1.z += c1.vz*dt;
                }
            }
        }

        this->t += dt;
    }